

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_rm_ep(nn_sock *self,int eid)

{
  nn_ctx *self_00;
  nn_ctx *pnVar1;
  int in_ESI;
  long in_RDI;
  nn_ep *ep;
  nn_list_item *it;
  nn_list_item *in_stack_ffffffffffffffb8;
  nn_list *in_stack_ffffffffffffffc0;
  nn_list_item *it_00;
  nn_list_item *in_stack_ffffffffffffffc8;
  nn_list_item *local_28;
  nn_ctx *self_01;
  int local_4;
  
  nn_ctx_enter((nn_ctx *)0x136bab);
  self_00 = (nn_ctx *)nn_list_begin((nn_list *)(in_RDI + 0x118));
  while( true ) {
    local_28 = (nn_list_item *)0x0;
    self_01 = self_00;
    pnVar1 = (nn_ctx *)nn_list_end((nn_list *)(in_RDI + 0x118));
    if (self_00 == pnVar1) break;
    if (self_01 == (nn_ctx *)0x0) {
      in_stack_ffffffffffffffc8 = (nn_list_item *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 = (nn_list_item *)&self_01[-2].events.tail;
    }
    local_28 = in_stack_ffffffffffffffc8;
    if (*(int *)((long)&in_stack_ffffffffffffffc8[7].next + 4) == in_ESI) break;
    self_00 = (nn_ctx *)nn_list_next(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (local_28 == (nn_list_item *)0x0) {
    nn_ctx_leave(self_01);
    local_4 = -0x16;
  }
  else {
    nn_list_erase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    it_00 = (nn_list_item *)&local_28[7].prev;
    nn_list_end((nn_list *)(in_RDI + 0x128));
    nn_list_insert((nn_list *)self_00,in_stack_ffffffffffffffc8,it_00);
    nn_ep_stop((nn_ep *)0x136cd9);
    nn_ctx_leave(self_01);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_sock_rm_ep (struct nn_sock *self, int eid)
{
    struct nn_list_item *it;
    struct nn_ep *ep;

    nn_ctx_enter (&self->ctx);

    /*  Find the specified enpoint. */
    ep = NULL;
    for (it = nn_list_begin (&self->eps);
          it != nn_list_end (&self->eps);
          it = nn_list_next (&self->eps, it)) {
        ep = nn_cont (it, struct nn_ep, item);
        if (ep->eid == eid)
            break;
        ep = NULL;
    }

    /*  The endpoint doesn't exist. */
    if (!ep) {
        nn_ctx_leave (&self->ctx);
        return -EINVAL;
    }

    /*  Move the endpoint from the list of active endpoints to the list
        of shutting down endpoints. */
    nn_list_erase (&self->eps, &ep->item);
    nn_list_insert (&self->sdeps, &ep->item, nn_list_end (&self->sdeps));

    /*  Ask the endpoint to stop. Actual terminatation may be delayed
        by the transport. */
    nn_ep_stop (ep);

    nn_ctx_leave (&self->ctx);

    return 0;
}